

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioDiagDialog.cpp
# Opt level: O0

void __thiscall
AudioDiagDialog::AudioDiagDialog(AudioDiagDialog *this,Renderer *renderer,QWidget *parent)

{
  ConnectionType type;
  QObject *context;
  anon_class_8_1_8991fb9c_for_function slot;
  Object local_260 [8];
  code *local_258;
  undefined8 local_250;
  AudioDiagDialog *local_248;
  Object local_240 [8];
  code *local_238;
  undefined8 uStack_230;
  code *local_228;
  undefined8 local_220;
  Object local_218 [8];
  code *local_210;
  undefined8 uStack_208;
  code *local_200;
  undefined8 local_1f8;
  Object local_1f0 [8];
  code *local_1e8;
  undefined8 uStack_1e0;
  code *local_1d8;
  undefined8 local_1d0;
  Object local_1c8 [8];
  QString local_1c0;
  QString local_1a8;
  QFlags<Qt::AlignmentFlag> local_18c;
  QString local_188;
  QFlags<Qt::AlignmentFlag> local_16c;
  QFlags<Qt::AlignmentFlag> local_168;
  QFlags<Qt::AlignmentFlag> local_164;
  QFlags<Qt::AlignmentFlag> local_160;
  QFlags<Qt::AlignmentFlag> local_15c;
  QString local_158;
  QString local_140;
  QString local_128;
  QString local_110;
  QString local_f8;
  QString local_e0;
  QString local_c8;
  QString local_b0;
  QString local_98;
  QString local_80;
  QFlags<Qt::WindowType> local_64;
  QFlags<Qt::WindowType> local_60;
  QFlags<Qt::WindowType> local_5c;
  QFlags<Qt::WindowType> local_58;
  QFlags<Qt::WindowType> local_54;
  QString local_50;
  QFlags<Qt::WindowType> local_28;
  Int local_24;
  QWidget *local_20;
  QWidget *parent_local;
  Renderer *renderer_local;
  AudioDiagDialog *this_local;
  
  local_20 = parent;
  parent_local = (QWidget *)renderer;
  renderer_local = (Renderer *)this;
  local_28 = Qt::operator|(WindowTitleHint,WindowSystemMenuHint);
  local_24 = (Int)QFlags<Qt::WindowType>::operator|(&local_28,WindowCloseButtonHint);
  QDialog::QDialog(&this->super_QDialog,parent,(QFlags_conflict1 *)(ulong)local_24);
  *(undefined ***)this = &PTR_metaObject_002d4560;
  *(undefined ***)&this->field_0x10 = &PTR__AudioDiagDialog_002d4738;
  this->mRenderer = (Renderer *)parent_local;
  this->mTimerId = -1;
  this->mLastIsRunning = true;
  QVBoxLayout::QVBoxLayout(&this->mLayout);
  tr(&local_50,"Render statistics",(char *)0x0,-1);
  QGroupBox::QGroupBox(&this->mRenderGroup,(QString *)&local_50,(QWidget *)0x0);
  QString::~QString(&local_50);
  QFormLayout::QFormLayout(&this->mRenderLayout,(QWidget *)0x0);
  QFlags<Qt::WindowType>::QFlags(&local_54);
  QLabel::QLabel(&this->mUnderrunLabel,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_54.i);
  QProgressBar::QProgressBar(&this->mBufferProgress,(QWidget *)0x0);
  QFlags<Qt::WindowType>::QFlags(&local_58);
  QLabel::QLabel(&this->mStatusLabel,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_58.i);
  QFlags<Qt::WindowType>::QFlags(&local_5c);
  QLabel::QLabel(&this->mElapsedLabel,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_5c.i);
  QFlags<Qt::WindowType>::QFlags(&local_60);
  QLabel::QLabel(&this->mPeriodLabel,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_60.i);
  QFlags<Qt::WindowType>::QFlags(&local_64);
  QLabel::QLabel(&this->mPeriodWrittenLabel,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_64.i);
  tr(&local_80,"Clear",(char *)0x0,-1);
  QPushButton::QPushButton(&this->mClearButton,(QString *)&local_80,(QWidget *)0x0);
  QString::~QString(&local_80);
  QHBoxLayout::QHBoxLayout(&this->mButtonLayout);
  tr(&local_98,"Auto refresh",(char *)0x0,-1);
  QCheckBox::QCheckBox(&this->mAutoRefreshCheck,(QString *)&local_98,(QWidget *)0x0);
  QString::~QString(&local_98);
  QSpinBox::QSpinBox(&this->mIntervalSpin,(QWidget *)0x0);
  tr(&local_b0,"Refresh",(char *)0x0,-1);
  QPushButton::QPushButton(&this->mRefreshButton,(QString *)&local_b0,(QWidget *)0x0);
  QString::~QString(&local_b0);
  tr(&local_c8,"Close",(char *)0x0,-1);
  QPushButton::QPushButton(&this->mCloseButton,(QString *)&local_c8,(QWidget *)0x0);
  QString::~QString(&local_c8);
  tr(&local_e0,"Underruns",(char *)0x0,-1);
  QFormLayout::addRow((QString *)&this->mRenderLayout,(QWidget *)&local_e0);
  QString::~QString(&local_e0);
  tr(&local_f8,"Buffer usage",(char *)0x0,-1);
  QFormLayout::addRow((QString *)&this->mRenderLayout,(QWidget *)&local_f8);
  QString::~QString(&local_f8);
  tr(&local_110,"Status",(char *)0x0,-1);
  QFormLayout::addRow((QString *)&this->mRenderLayout,(QWidget *)&local_110);
  QString::~QString(&local_110);
  tr(&local_128,"Elapsed",(char *)0x0,-1);
  QFormLayout::addRow((QString *)&this->mRenderLayout,(QWidget *)&local_128);
  QString::~QString(&local_128);
  tr(&local_140,"Refresh rate",(char *)0x0,-1);
  QFormLayout::addRow((QString *)&this->mRenderLayout,(QWidget *)&local_140);
  QString::~QString(&local_140);
  tr(&local_158,"Samples written",(char *)0x0,-1);
  QFormLayout::addRow((QString *)&this->mRenderLayout,(QWidget *)&local_158);
  QString::~QString(&local_158);
  type = (ConnectionType)this;
  QFormLayout::setWidget(type + UniqueConnection,6,(QWidget *)0x0);
  QWidget::setLayout((QLayout *)&this->mRenderGroup);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_15c);
  QBoxLayout::addWidget((QWidget *)&this->mButtonLayout,type + 0x1d8,(QFlags_conflict1 *)0x0);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_160);
  QBoxLayout::addWidget((QWidget *)&this->mButtonLayout,type + 0x200,(QFlags_conflict1 *)0x0);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_164);
  QBoxLayout::addWidget((QWidget *)&this->mButtonLayout,type + 0x228,(QFlags_conflict1 *)0x0);
  QBoxLayout::addStretch(type + 0x1b8);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_168);
  QBoxLayout::addWidget((QWidget *)&this->mButtonLayout,type + 0x250,(QFlags_conflict1 *)0x0);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_16c);
  QBoxLayout::addWidget((QWidget *)&this->mLayout,type + 0x58,(QFlags_conflict1 *)0x1);
  QBoxLayout::addLayout((QLayout *)&this->mLayout,type + 0x1b8);
  QLayout::setSizeConstraint(type + 0x38);
  QWidget::setLayout((QLayout *)this);
  tr(&local_188," ms",(char *)0x0,-1);
  QSpinBox::setSuffix((QString *)&this->mIntervalSpin);
  QString::~QString(&local_188);
  QSpinBox::setRange(type + 0x200,10);
  QSpinBox::setValue(type + 0x200);
  QCheckBox::setCheckState(type + 0x1d8);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_18c,AlignCenter);
  QProgressBar::setAlignment((QFlags_conflict1 *)&this->mBufferProgress);
  tr(&local_1a8,"%p% (%v / %m samples)",(char *)0x0,-1);
  QProgressBar::setFormat((QString *)&this->mBufferProgress);
  QString::~QString(&local_1a8);
  QPushButton::setDefault((bool)((char)this + 'P'));
  setElapsed(this,0);
  setRunningLabel(this,false);
  tr(&local_1c0,"Audio diagnostics",(char *)0x0,-1);
  QWidget::setWindowTitle((QString *)this);
  QString::~QString(&local_1c0);
  local_1d8 = QAbstractButton::clicked;
  local_1d0 = 0;
  local_1e8 = QWidget::close;
  uStack_1e0 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),bool(QWidget::*)()>
            (local_1c8,(offset_in_QAbstractButton_to_subr)&this->mCloseButton,
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_1c8);
  local_200 = QAbstractButton::clicked;
  local_1f8 = 0;
  local_210 = refresh;
  uStack_208 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(AudioDiagDialog::*)()>
            (local_1f0,(offset_in_QAbstractButton_to_subr)&this->mRefreshButton,
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_1f0);
  local_228 = QAbstractButton::clicked;
  local_220 = 0;
  local_238 = Renderer::clearDiagnostics;
  uStack_230 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(Renderer::*)()>
            (local_218,(offset_in_QAbstractButton_to_subr)&this->mClearButton,
             (Object *)QAbstractButton::clicked,0,(ConnectionType)this->mRenderer);
  QMetaObject::Connection::~Connection((Connection *)local_218);
  local_258 = QCheckBox::stateChanged;
  local_250 = 0;
  local_248 = this;
  QObject::
  connect<void(QCheckBox::*)(int),AudioDiagDialog::AudioDiagDialog(Renderer&,QWidget*)::__0>
            (local_240,(offset_in_QCheckBox_to_subr)&this->mAutoRefreshCheck,
             (QObject *)QCheckBox::stateChanged,(anon_class_8_1_8991fb9c_for_function)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_240);
  context = (QObject *)
            QNonConstOverload<int>::operator()
                      ((QNonConstOverload<int> *)&qOverload<int>,
                       (offset_in_QSpinBox_to_subr)QSpinBox::valueChanged);
  QObject::connect<void(QSpinBox::*)(int),AudioDiagDialog::AudioDiagDialog(Renderer&,QWidget*)::__1>
            (local_260,(offset_in_QSpinBox_to_subr)&this->mIntervalSpin,context,slot,type);
  QMetaObject::Connection::~Connection((Connection *)local_260);
  return;
}

Assistant:

AudioDiagDialog::AudioDiagDialog(Renderer &renderer, QWidget *parent) :
    QDialog(parent, Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint),
    mRenderer(renderer),
    mTimerId(-1),
    mLastIsRunning(true),
    mLayout(),
    mRenderGroup(tr("Render statistics")),
    mRenderLayout(),
    mUnderrunLabel(),
    mBufferProgress(),
    mStatusLabel(),
    mElapsedLabel(),
    mPeriodLabel(),
    mPeriodWrittenLabel(),
    mClearButton(tr("Clear")),
    mButtonLayout(),
    mAutoRefreshCheck(tr("Auto refresh")),
    mIntervalSpin(),
    mRefreshButton(tr("Refresh")),
    mCloseButton(tr("Close"))
{
    mRenderLayout.addRow(tr("Underruns"), &mUnderrunLabel);
    mRenderLayout.addRow(tr("Buffer usage"), &mBufferProgress);
    mRenderLayout.addRow(tr("Status"), &mStatusLabel);
    mRenderLayout.addRow(tr("Elapsed"), &mElapsedLabel);
    mRenderLayout.addRow(tr("Refresh rate"), &mPeriodLabel);
    mRenderLayout.addRow(tr("Samples written"), &mPeriodWrittenLabel);
    mRenderLayout.setWidget(6, QFormLayout::LabelRole, &mClearButton);
    mRenderGroup.setLayout(&mRenderLayout);

    mButtonLayout.addWidget(&mAutoRefreshCheck);
    mButtonLayout.addWidget(&mIntervalSpin);
    mButtonLayout.addWidget(&mRefreshButton);
    mButtonLayout.addStretch();
    mButtonLayout.addWidget(&mCloseButton);

    mLayout.addWidget(&mRenderGroup, 1);
    mLayout.addLayout(&mButtonLayout);
    mLayout.setSizeConstraint(QLayout::SizeConstraint::SetFixedSize);
    setLayout(&mLayout);

    mIntervalSpin.setSuffix(tr(" ms"));
    mIntervalSpin.setRange(10, 60000);
    mIntervalSpin.setValue(TU::DEFAULT_REFRESH_INTERVAL);

    mAutoRefreshCheck.setCheckState(Qt::Checked);

    mBufferProgress.setAlignment(Qt::AlignCenter);
    mBufferProgress.setFormat(tr("%p% (%v / %m samples)"));

    mCloseButton.setDefault(true);

    setElapsed(0);
    setRunningLabel(false);
    setWindowTitle(tr("Audio diagnostics"));

    connect(&mCloseButton, &QPushButton::clicked, this, &AudioDiagDialog::close);
    connect(&mRefreshButton, &QPushButton::clicked, this, &AudioDiagDialog::refresh);
    connect(&mClearButton, &QPushButton::clicked, &mRenderer, &Renderer::clearDiagnostics);
    connect(&mAutoRefreshCheck, &QCheckBox::stateChanged, this,
        [this](int state) {
            bool checked = state == Qt::Checked;
            mIntervalSpin.setEnabled(checked);
            if (checked) {
                mTimerId = startTimer(mIntervalSpin.value());
            } else {
                killTimer(mTimerId);
            }
        });
    connect(&mIntervalSpin, qOverload<int>(&QSpinBox::valueChanged), this,
        [this](int value) {
            if (mTimerId != -1) {
                killTimer(mTimerId);
                mTimerId = startTimer(value);
            }
        });
    
}